

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O3

void __thiscall irr::video::COpenGL3DriverBase::initVersion(COpenGL3DriverBase *this)

{
  OpenGLVersion OVar1;
  GLubyte *pGVar2;
  double __x;
  
  pGVar2 = (*GL.GetString)(0x1f02);
  core::string<char>::operator=(&this->Name,pGVar2);
  CNullDriver::printVersion(&this->super_CNullDriver);
  pGVar2 = (*GL.GetString)(0x1f00);
  core::string<char>::operator=(&this->VendorName,pGVar2);
  os::Printer::log(__x);
  OVar1 = (OpenGLVersion)
          (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x84])(this);
  this->Version = OVar1;
  return;
}

Assistant:

void COpenGL3DriverBase::initVersion()
{
	Name = GL.GetString(GL_VERSION);
	printVersion();

	// print renderer information
	VendorName = GL.GetString(GL_VENDOR);
	os::Printer::log("Vendor", VendorName.c_str(), ELL_INFORMATION);

	Version = getVersionFromOpenGL();
}